

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O2

void __thiscall
QCommandLineParserPrivate::~QCommandLineParserPrivate(QCommandLineParserPrivate *this)

{
  QArrayDataPointer<QCommandLineParserPrivate::PositionalArgumentDefinition>::~QArrayDataPointer
            (&(this->positionalArgumentDefinitions).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->description).d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->unknownOptionNames).d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->positionalArgumentList).d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->optionNames).d);
  QHash<long_long,_QList<QString>_>::~QHash(&this->optionValuesHash);
  QHash<QString,_long_long>::~QHash(&this->nameHash);
  QArrayDataPointer<QCommandLineOption>::~QArrayDataPointer(&(this->commandLineOptionList).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this);
  return;
}

Assistant:

inline QCommandLineParserPrivate()
        : singleDashWordOptionMode(QCommandLineParser::ParseAsCompactedShortOptions),
          optionsAfterPositionalArgumentsMode(QCommandLineParser::ParseAsOptions),
          builtinVersionOption(false),
          builtinHelpOption(false),
          needsParsing(true)
    { }